

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_guarded.hpp
# Opt level: O2

atomic_guarded<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::mutex>
* __thiscall
gmlc::libguarded::atomic_guarded<std::__cxx11::string,std::mutex>::operator=
          (atomic_guarded<std::__cxx11::string,std::mutex> *this,
          basic_string_view<char,_std::char_traits<char>_> *newObj)

{
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(this + 0x20))->__data);
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)this,(basic_string_view<char,_std::char_traits<char>_> *)newObj);
  pthread_mutex_unlock((pthread_mutex_t *)(this + 0x20));
  return (atomic_guarded<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::mutex>
          *)this;
}

Assistant:

atomic_guarded& operator=(objType&& newObj)
    {  // uses a forwarding reference
        std::lock_guard<M> glock(m_mutex);
        m_obj = std::forward<objType>(newObj);
        return *this;
    }